

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_matcher.cxx
# Opt level: O0

string * __thiscall
IntegratorXX::Matchers::WithinAbsMatcher::describe_abi_cxx11_
          (string *__return_storage_ptr__,WithinAbsMatcher *this)

{
  _Setprecision _Var1;
  ostream *poVar2;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  WithinAbsMatcher *local_18;
  WithinAbsMatcher *this_local;
  
  local_18 = this;
  this_local = (WithinAbsMatcher *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::ostream::operator<<(local_190,std::scientific);
  _Var1 = std::setprecision(6);
  std::operator<<(local_190,_Var1);
  poVar2 = std::operator<<(local_190," is not within ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_margin);
  poVar2 = std::operator<<(poVar2," of ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_target);
  poVar2 = std::operator<<(poVar2,"\n(");
  poVar2 = std::operator<<(poVar2,(string *)&this->m_msg);
  std::operator<<(poVar2,")");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string WithinAbsMatcher::describe() const {
        std::stringstream ss;
        ss << std::scientific;
        ss << std::setprecision(6);
        ss << " is not within " << m_margin << " of " << m_target << "\n(" << m_msg << ")";
        return ss.str();
    }